

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O0

float __thiscall GuillotineBinPack::Occupancy(GuillotineBinPack *this)

{
  int iVar1;
  uint uVar2;
  Rect *pRVar3;
  float local_34;
  uint local_1c;
  ulong uStack_18;
  uint i;
  unsigned_long usedSurfaceArea;
  GuillotineBinPack *this_local;
  
  uStack_18 = 0;
  for (local_1c = 0; uVar2 = TArray<Rect,_Rect>::Size(&this->usedRectangles), local_1c < uVar2;
      local_1c = local_1c + 1) {
    pRVar3 = TArray<Rect,_Rect>::operator[](&this->usedRectangles,(ulong)local_1c);
    iVar1 = pRVar3->width;
    pRVar3 = TArray<Rect,_Rect>::operator[](&this->usedRectangles,(ulong)local_1c);
    uStack_18 = (long)(iVar1 * pRVar3->height) + uStack_18;
  }
  local_34 = (float)uStack_18;
  return local_34 / (float)(this->binWidth * this->binHeight);
}

Assistant:

float GuillotineBinPack::Occupancy() const
{
	///\todo The occupancy rate could be cached/tracked incrementally instead
	///      of looping through the list of packed rectangles here.
	unsigned long usedSurfaceArea = 0;
	for(unsigned i = 0; i < usedRectangles.Size(); ++i)
		usedSurfaceArea += usedRectangles[i].width * usedRectangles[i].height;

	return (float)usedSurfaceArea / (binWidth * binHeight);
}